

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::rust::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,FieldDescriptor *field)

{
  RustGeneratorContext *pRVar1;
  float fVar2;
  RustFieldType RVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 local_f0 [48];
  size_type *local_c0;
  size_type *local_b8;
  size_type local_b0 [4];
  string local_90;
  string local_70;
  AlphaNum local_50;
  
  RVar3 = GetRustFieldType((FieldDescriptor *)ctx);
  switch(RVar3) {
  case INT32:
    local_f0._0_8_ = ZEXT48(*(uint *)&ctx[3].rust_generator_context_);
    local_f0._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
    pcVar6 = "%di32";
    break;
  case INT64:
    local_f0._0_8_ = ctx[3].rust_generator_context_;
    local_f0._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
    pcVar6 = "%di64";
    break;
  case UINT32:
    local_f0._0_8_ = ZEXT48(*(uint *)&ctx[3].rust_generator_context_);
    local_f0._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
    pcVar6 = "%uu32";
    break;
  case UINT64:
    local_f0._0_8_ = ctx[3].rust_generator_context_;
    local_f0._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
    ;
    pcVar6 = "%uu64";
    break;
  case DOUBLE:
    pRVar1 = ctx[3].rust_generator_context_;
    if ((ulong)ABS((double)pRVar1) < 0x7ff0000000000000) {
      google::protobuf::io::SimpleDtoa_abi_cxx11_((double)pRVar1);
      local_f0._0_8_ = local_b8;
      local_f0._8_8_ = local_c0;
      local_50.piece_._M_len = 3;
      local_50.piece_._M_str = "f64";
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_f0)
      ;
      goto LAB_00318925;
    }
    paVar4 = &__return_storage_ptr__->field_2;
    if (!NAN((double)pRVar1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
      if ((double)pRVar1 < INFINITY) {
        pcVar7 = "f64::NEG_INFINITY";
        pcVar6 = "";
      }
      else {
        pcVar7 = "f64::INFINITY";
        pcVar6 = "";
      }
      goto LAB_00318960;
    }
    goto LAB_00318a03;
  case FLOAT:
    fVar2 = *(float *)&ctx[3].rust_generator_context_;
    if (0x7f7fffff < (uint)ABS(fVar2)) {
      if (NAN(fVar2)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "f32::NAN";
        pcVar6 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (fVar2 < INFINITY) {
          pcVar7 = "f32::NEG_INFINITY";
          pcVar6 = "";
        }
        else {
          pcVar7 = "f32::INFINITY";
          pcVar6 = "";
        }
      }
      goto LAB_00318960;
    }
    google::protobuf::io::SimpleFtoa_abi_cxx11_(fVar2);
    local_f0._0_8_ = local_b8;
    local_f0._8_8_ = local_c0;
    local_50.piece_._M_len = 3;
    local_50.piece_._M_str = "f32";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_f0);
LAB_00318925:
    local_f0._16_8_ = local_b0[0];
    local_70._M_dataplus._M_p = (pointer)local_c0;
    if (local_c0 == local_b0) {
      return __return_storage_ptr__;
    }
    goto LAB_00318938;
  case BOOL:
    local_f0._0_8_ = ZEXT18(*(byte *)&ctx[3].rust_generator_context_);
    local_f0._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<bool>;
    pcVar6 = "%v";
    uVar5 = 2;
    goto LAB_00318819;
  case ENUM:
    RsTypePath_abi_cxx11_
              (&local_70,this,ctx,(FieldDescriptor *)&switchD_00318614::switchdataD_00475f94);
    local_f0._0_8_ = local_70._M_string_length;
    local_f0._8_8_ = local_70._M_dataplus._M_p;
    local_50.piece_._M_len = 2;
    local_50.piece_._M_str = "::";
    auVar8 = google::protobuf::FieldDescriptor::default_value_enum();
    EnumValueRsName_abi_cxx11_(&local_90,auVar8._0_8_,auVar8._8_8_);
    local_c0 = (size_type *)local_90._M_string_length;
    local_b8 = (size_type *)local_90._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_f0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_f0._16_8_ = local_70.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00318938;
  case STRING:
  case BYTES:
    absl::lts_20240722::CHexEscape_abi_cxx11_
              (local_f0,(ctx[3].rust_generator_context_)->import_path_to_crate_name_,
               (ctx[3].rust_generator_context_)->files_in_current_crate_);
    local_50.piece_._M_str =
         (char *)absl::lts_20240722::str_format_internal::FormatArgImpl::
                 Dispatch<std::__cxx11::string>;
    local_50.piece_._M_len = (size_t)local_f0;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (__return_storage_ptr__,"b\"%s\"",5,&local_50,1);
    local_70._M_dataplus._M_p = (pointer)local_f0._0_8_;
    if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) {
      return __return_storage_ptr__;
    }
LAB_00318938:
    operator_delete(local_70._M_dataplus._M_p,local_f0._16_8_ + 1);
    return __return_storage_ptr__;
  case MESSAGE:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x58);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              ((LogMessageFatal *)local_f0,0x1e,"Messages can\'t have defaults: ");
    local_50.piece_._M_len = (&FieldDescriptor::kTypeToName)[*(byte *)((long)&ctx->opts_ + 2)];
    absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
              ((LogMessage *)local_f0,(char **)&local_50);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_f0)
    ;
  default:
    __return_storage_ptr__ = (string *)local_f0;
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              ((LogMessage *)__return_storage_ptr__,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x5a);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)__return_storage_ptr__,(char (*) [12])"unreachable");
    DefaultValue_abi_cxx11_();
    paVar4 = extraout_RAX;
LAB_00318a03:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
    pcVar7 = "f64::NAN";
    pcVar6 = "";
LAB_00318960:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
    return __return_storage_ptr__;
  }
  uVar5 = 5;
LAB_00318819:
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,pcVar6,uVar5,local_f0,1);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(Context& ctx, const FieldDescriptor& field) {
  switch (GetRustFieldType(field)) {
    case RustFieldType::DOUBLE:
      if (std::isfinite(field.default_value_double())) {
        return absl::StrCat(io::SimpleDtoa(field.default_value_double()),
                            "f64");
      } else if (std::isnan(field.default_value_double())) {
        return std::string("f64::NAN");
      } else if (field.default_value_double() ==
                 std::numeric_limits<double>::infinity()) {
        return std::string("f64::INFINITY");
      } else if (field.default_value_double() ==
                 -std::numeric_limits<double>::infinity()) {
        return std::string("f64::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::FLOAT:
      if (std::isfinite(field.default_value_float())) {
        return absl::StrCat(io::SimpleFtoa(field.default_value_float()), "f32");
      } else if (std::isnan(field.default_value_float())) {
        return std::string("f32::NAN");
      } else if (field.default_value_float() ==
                 std::numeric_limits<float>::infinity()) {
        return std::string("f32::INFINITY");
      } else if (field.default_value_float() ==
                 -std::numeric_limits<float>::infinity()) {
        return std::string("f32::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::INT32:
      return absl::StrFormat("%di32", field.default_value_int32());
    case RustFieldType::INT64:
      return absl::StrFormat("%di64", field.default_value_int64());
    case RustFieldType::UINT64:
      return absl::StrFormat("%uu64", field.default_value_uint64());
    case RustFieldType::UINT32:
      return absl::StrFormat("%uu32", field.default_value_uint32());
    case RustFieldType::BOOL:
      return absl::StrFormat("%v", field.default_value_bool());
    case RustFieldType::STRING:
    case RustFieldType::BYTES:
      return absl::StrFormat("b\"%s\"",
                             absl::CHexEscape(field.default_value_string()));
    case RustFieldType::ENUM:
      // `$EnumName$::default()` might seem like the right choice here, but
      // it is not. The default value for the enum type isn't the same as the
      // field, since in `syntax = "proto2"`, an enum field can have a default
      // value other than the first listed in the enum.
      //
      // Even in cases where there is no custom field default, `default()` can't
      // be used. This is because the vtables for field mutators store the
      // default value. They are `static`s which are constructed with a `const`
      // expression. Trait methods in a `const` context aren't currently stable.
      return absl::StrCat(RsTypePath(ctx, field),
                          "::", EnumValueRsName(*field.default_value_enum()));
    case RustFieldType::MESSAGE:
      ABSL_LOG(FATAL) << "Messages can't have defaults: " << field.type_name();
  }
  ABSL_LOG(ERROR) << "unreachable";
  internal::Unreachable();
}